

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeMessage
          (ParserImpl *this,Message *message,string *delimiter)

{
  bool bVar1;
  byte local_a2;
  allocator local_81;
  string local_80;
  allocator local_49;
  string local_48;
  string *local_28;
  string *delimiter_local;
  Message *message_local;
  ParserImpl *this_local;
  
  local_28 = delimiter;
  delimiter_local = (string *)message;
  message_local = (Message *)this;
  while( true ) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,">",&local_49);
    bVar1 = LookingAt(this,&local_48);
    local_a2 = 0;
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_80,"}",&local_81);
      bVar1 = LookingAt(this,&local_80);
      local_a2 = bVar1 ^ 0xff;
      std::__cxx11::string::~string((string *)&local_80);
      std::allocator<char>::~allocator((allocator<char> *)&local_81);
    }
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if ((local_a2 & 1) == 0) break;
    bVar1 = ConsumeField(this,(Message *)delimiter_local);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = Consume(this,delimiter);
  if (!bVar1) {
    return false;
  }
  return true;
}

Assistant:

bool ConsumeMessage(Message* message, const string delimiter) {
    while (!LookingAt(">") &&  !LookingAt("}")) {
      DO(ConsumeField(message));
    }

    // Confirm that we have a valid ending delimiter.
    DO(Consume(delimiter));
    return true;
  }